

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QStringList * QStringConverter::availableCodecs(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  storage_type *in_RCX;
  long lVar4;
  QList<QString> *in_RDI;
  long asize;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  UErrorCode status;
  QArrayDataPointer<char16_t> local_70;
  char *local_58;
  int local_4c;
  QByteArrayView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = ucnv_countAvailable_70();
  asize = (long)(iVar1 + 1);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  (in_RDI->d).size = 0;
  QList<QString>::reserve(in_RDI,asize);
  lVar4 = 0;
  if (asize < 1) {
    asize = lVar4;
  }
  for (; asize != lVar4; lVar4 = lVar4 + 1) {
    if (lVar4 == 0) {
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_48,&encodingInterfaces[8].name);
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)local_48.m_data;
      QString::fromLatin1((QString *)&local_70,(QString *)local_48.m_size,ba_00);
    }
    else {
      local_4c = 0;
      pcVar2 = (char *)ucnv_getAvailableName_70((int)lVar4 + -1);
      local_58 = (char *)ucnv_getStandardName_70(pcVar2,"MIME",&local_4c);
      if ((0 < local_4c) || (local_58 == (char *)0x0)) {
        local_4c = 0;
        pcVar3 = (char *)ucnv_getStandardName_70(pcVar2,"IANA",&local_4c);
        local_58 = pcVar2;
        if (pcVar3 != (char *)0x0) {
          local_58 = pcVar3;
        }
      }
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_48,&local_58);
      ba.m_data = in_RCX;
      ba.m_size = (qsizetype)local_48.m_data;
      QString::fromLatin1((QString *)&local_70,(QString *)local_48.m_size,ba);
    }
    QList<QString>::emplaceBack<QString>(in_RDI,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QStringConverter::availableCodecs()
{
    auto availableCodec = [](qsizetype index) -> QString
    {
    #if !defined(QT_USE_ICU_CODECS)
        return QString::fromLatin1(encodingInterfaces[index].name);
    #else
        if (index == 0) // "Locale", not provided by icu
            return QString::fromLatin1(
                        encodingInterfaces[QStringConverter::Encoding::System].name);
        QT_COM_THREAD_INIT
        // this mirrors the setup we do to set a converters name
        UErrorCode status = U_ZERO_ERROR;
        auto icuName = ucnv_getAvailableName(int32_t(index - 1));
        const char *standardName = ucnv_getStandardName(icuName, "MIME", &status);
        if (U_FAILURE(status) || !standardName) {
            status = U_ZERO_ERROR;
            standardName = ucnv_getStandardName(icuName, "IANA", &status);
        }
        if (!standardName)
            standardName = icuName;
        return QString::fromLatin1(standardName);
    #endif
    };

    qsizetype codecCount = availableCodecCount();
    QStringList result;
    result.reserve(codecCount);
    for (qsizetype i = 0; i < codecCount; ++i)
        result.push_back(availableCodec(i));
    return result;
}